

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O2

void __thiscall
Assimp::MD5Importer::AttachChilds_Mesh
          (MD5Importer *this,int iParentID,aiNode *piParent,BoneList *bones)

{
  uint *puVar1;
  undefined8 *puVar2;
  aiMatrix4x4 *paVar3;
  pointer pBVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  pointer pBVar17;
  aiNode **ppaVar18;
  aiNode *this_00;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  aiMatrix4x4 *m;
  long lVar22;
  aiMatrix4x4t<float> temp;
  aiQuaternion local_448;
  aiMatrix4x4t<float> local_438 [16];
  
  if ((piParent != (aiNode *)0x0) && (piParent->mNumChildren == 0)) {
    uVar19 = 0;
    lVar20 = 0x404;
    for (uVar21 = 0;
        pBVar4 = (bones->
                 super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>).
                 _M_impl.super__Vector_impl_data._M_start,
        (long)uVar21 <
        (long)(int)(((long)(bones->
                           super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar4) / 0x4b4);
        uVar21 = uVar21 + 1) {
      if (((uint)iParentID != uVar21) &&
         (*(int *)((long)(pBVar4->super_BaseJointDescription).mName.data +
                  lVar20 + 0xfffffffffffffffcU) == iParentID)) {
        uVar19 = uVar19 + 1;
        piParent->mNumChildren = uVar19;
      }
      lVar20 = lVar20 + 0x4b4;
    }
    if (uVar19 != 0) {
      ppaVar18 = (aiNode **)operator_new__((ulong)uVar19 << 3);
      piParent->mChildren = ppaVar18;
      lVar20 = 0;
      for (lVar22 = 0;
          pBVar4 = (bones->
                   super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                   )._M_impl.super__Vector_impl_data._M_start,
          lVar22 < (int)(((long)(bones->
                                super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar4) / 0x4b4)
          ; lVar22 = lVar22 + 1) {
        if (((ulong)(uint)iParentID * 0x4b4 != lVar20) &&
           (*(int *)((long)&(pBVar4->super_BaseJointDescription).mParentIndex + lVar20) == iParentID
           )) {
          this_00 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(this_00);
          ppaVar18 = piParent->mChildren;
          piParent->mChildren = ppaVar18 + 1;
          *ppaVar18 = this_00;
          pBVar4 = (bones->
                   super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          puVar1 = (uint *)((long)(pBVar4->super_BaseJointDescription).mName.data +
                           lVar20 + 0xfffffffffffffffcU);
          uVar19 = *puVar1;
          if (0x3fe < uVar19) {
            uVar19 = 0x3ff;
          }
          uVar21 = (ulong)uVar19;
          memcpy(&local_438[0].a2,puVar1 + 1,uVar21);
          *(undefined1 *)((long)&local_438[0].a2 + uVar21) = 0;
          (this_00->mName).length = uVar19;
          memcpy((this_00->mName).data,&local_438[0].a2,uVar21);
          (this_00->mName).data[uVar21] = '\0';
          this_00->mParent = piParent;
          local_448.w = 1.0;
          local_448.x = 0.0;
          local_448.y = 0.0;
          local_448.z = 0.0;
          MD5::ConvertQuaternion
                    ((aiVector3D *)((long)&(pBVar4->mRotationQuat).x + lVar20),&local_448);
          aiQuaterniont<float>::GetMatrix((aiMatrix3x3t<float> *)local_438,&local_448);
          pBVar4 = (bones->
                   super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)&(pBVar4->mTransform).a1 + lVar20) = local_438[0]._0_8_;
          *(float *)((long)&(pBVar4->mTransform).a3 + lVar20) = local_438[0].a3;
          *(undefined4 *)((long)&(pBVar4->mTransform).a4 + lVar20) = 0;
          *(ulong *)((long)&(pBVar4->mTransform).b1 + lVar20) =
               CONCAT44(local_438[0].b1,local_438[0].a4);
          *(float *)((long)&(pBVar4->mTransform).b3 + lVar20) = local_438[0].b2;
          *(undefined4 *)((long)&(pBVar4->mTransform).b4 + lVar20) = 0;
          *(undefined8 *)((long)&(pBVar4->mTransform).c1 + lVar20) = local_438[0]._24_8_;
          *(float *)((long)&(pBVar4->mTransform).c3 + lVar20) = local_438[0].c1;
          puVar2 = (undefined8 *)((long)&(pBVar4->mTransform).c4 + lVar20);
          *puVar2 = 0;
          puVar2[1] = 0;
          *(undefined4 *)((long)&(pBVar4->mTransform).d4 + lVar20) = 0x3f800000;
          pBVar4 = (bones->
                   super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          *(undefined4 *)((long)&(pBVar4->mTransform).a4 + lVar20) =
               *(undefined4 *)((long)&(pBVar4->mPositionXYZ).x + lVar20);
          pBVar4 = (bones->
                   super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          *(undefined4 *)((long)&(pBVar4->mTransform).b4 + lVar20) =
               *(undefined4 *)((long)&(pBVar4->mPositionXYZ).y + lVar20);
          pBVar4 = (bones->
                   super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          *(undefined4 *)((long)&(pBVar4->mTransform).c4 + lVar20) =
               *(undefined4 *)((long)&(pBVar4->mPositionXYZ).z + lVar20);
          pBVar4 = (bones->
                   super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          puVar2 = (undefined8 *)((long)&(pBVar4->mTransform).a1 + lVar20);
          uVar5 = *puVar2;
          uVar6 = puVar2[1];
          puVar2 = (undefined8 *)((long)&(pBVar4->mTransform).b1 + lVar20);
          uVar7 = *puVar2;
          uVar8 = puVar2[1];
          puVar2 = (undefined8 *)((long)&(pBVar4->mTransform).c1 + lVar20);
          uVar9 = *puVar2;
          uVar10 = puVar2[1];
          puVar2 = (undefined8 *)((long)&(pBVar4->mTransform).d1 + lVar20);
          uVar11 = *puVar2;
          uVar12 = puVar2[1];
          puVar2 = (undefined8 *)((long)&(pBVar4->mInvTransform).d1 + lVar20);
          *puVar2 = uVar11;
          puVar2[1] = uVar12;
          puVar2 = (undefined8 *)((long)&(pBVar4->mInvTransform).c1 + lVar20);
          *puVar2 = uVar9;
          puVar2[1] = uVar10;
          puVar2 = (undefined8 *)((long)&(pBVar4->mInvTransform).b1 + lVar20);
          *puVar2 = uVar7;
          puVar2[1] = uVar8;
          puVar2 = (undefined8 *)((long)&(pBVar4->mInvTransform).a1 + lVar20);
          *puVar2 = uVar5;
          puVar2[1] = uVar6;
          (this_00->mTransformation).c1 = (float)(int)uVar9;
          (this_00->mTransformation).c2 = (float)(int)((ulong)uVar9 >> 0x20);
          (this_00->mTransformation).c3 = (float)(int)uVar10;
          (this_00->mTransformation).c4 = (float)(int)((ulong)uVar10 >> 0x20);
          (this_00->mTransformation).a1 = (float)(int)uVar5;
          (this_00->mTransformation).a2 = (float)(int)((ulong)uVar5 >> 0x20);
          (this_00->mTransformation).a3 = (float)(int)uVar6;
          (this_00->mTransformation).a4 = (float)(int)((ulong)uVar6 >> 0x20);
          (this_00->mTransformation).d1 = (float)(int)uVar11;
          (this_00->mTransformation).d2 = (float)(int)((ulong)uVar11 >> 0x20);
          (this_00->mTransformation).d3 = (float)(int)uVar12;
          (this_00->mTransformation).d4 = (float)(int)((ulong)uVar12 >> 0x20);
          (this_00->mTransformation).b1 = (float)(int)uVar7;
          (this_00->mTransformation).b2 = (float)(int)((ulong)uVar7 >> 0x20);
          (this_00->mTransformation).b3 = (float)(int)uVar8;
          (this_00->mTransformation).b4 = (float)(int)((ulong)uVar8 >> 0x20);
          aiMatrix4x4t<float>::Inverse
                    ((aiMatrix4x4t<float> *)
                     ((long)&(((bones->
                               super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                               )._M_impl.super__Vector_impl_data._M_start)->mInvTransform).a1 +
                     lVar20));
          if (iParentID != -1) {
            m = &this_00->mTransformation;
            pBVar4 = (bones->
                     super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            paVar3 = &pBVar4[iParentID].mInvTransform;
            local_438[0].a1 = paVar3->a1;
            local_438[0].a2 = paVar3->a2;
            uVar13 = paVar3->a3;
            uVar14 = paVar3->a4;
            pBVar17 = pBVar4 + iParentID;
            uVar15 = (pBVar17->mInvTransform).b1;
            uVar16 = (pBVar17->mInvTransform).b2;
            local_438[0]._24_8_ = *(undefined8 *)(&(pBVar17->mInvTransform).b1 + 2);
            pBVar17 = pBVar4 + iParentID;
            local_438[0].c1 = (pBVar17->mInvTransform).c1;
            local_438[0].c2 = (pBVar17->mInvTransform).c2;
            local_438[0]._40_8_ = *(undefined8 *)(&(pBVar17->mInvTransform).c1 + 2);
            pBVar4 = pBVar4 + iParentID;
            local_438[0].d1 = (pBVar4->mInvTransform).d1;
            local_438[0].d2 = (pBVar4->mInvTransform).d2;
            local_438[0]._56_8_ = *(undefined8 *)(&(pBVar4->mInvTransform).d1 + 2);
            local_438[0].a3 = (float)uVar13;
            local_438[0].a4 = (float)uVar14;
            local_438[0].b1 = (float)uVar15;
            local_438[0].b2 = (float)uVar16;
            aiMatrix4x4t<float>::operator*=(local_438,m);
            m->a1 = local_438[0].a1;
            m->a2 = local_438[0].a2;
            (this_00->mTransformation).a3 = local_438[0].a3;
            (this_00->mTransformation).a4 = local_438[0].a4;
            (this_00->mTransformation).b1 = local_438[0].b1;
            (this_00->mTransformation).b2 = local_438[0].b2;
            (this_00->mTransformation).b3 = local_438[0].b3;
            (this_00->mTransformation).b4 = local_438[0].b4;
            (this_00->mTransformation).c1 = local_438[0].c1;
            (this_00->mTransformation).c2 = local_438[0].c2;
            (this_00->mTransformation).c3 = local_438[0].c3;
            (this_00->mTransformation).c4 = local_438[0].c4;
            (this_00->mTransformation).d1 = local_438[0].d1;
            (this_00->mTransformation).d2 = local_438[0].d2;
            (this_00->mTransformation).d3 = local_438[0].d3;
            (this_00->mTransformation).d4 = local_438[0].d4;
          }
          AttachChilds_Mesh(this,(int)lVar22,this_00,bones);
        }
        lVar20 = lVar20 + 0x4b4;
      }
      piParent->mChildren = piParent->mChildren + -(ulong)piParent->mNumChildren;
    }
    return;
  }
  __assert_fail("__null != piParent && !piParent->mNumChildren",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MD5/MD5Loader.cpp"
                ,0x10b,"void Assimp::MD5Importer::AttachChilds_Mesh(int, aiNode *, BoneList &)");
}

Assistant:

void MD5Importer::AttachChilds_Mesh(int iParentID,aiNode* piParent, BoneList& bones)
{
    ai_assert(NULL != piParent && !piParent->mNumChildren);

    // First find out how many children we'll have
    for (int i = 0; i < (int)bones.size();++i)  {
        if (iParentID != i && bones[i].mParentIndex == iParentID)   {
            ++piParent->mNumChildren;
        }
    }
    if (piParent->mNumChildren) {
        piParent->mChildren = new aiNode*[piParent->mNumChildren];
        for (int i = 0; i < (int)bones.size();++i)  {
            // (avoid infinite recursion)
            if (iParentID != i && bones[i].mParentIndex == iParentID)   {
                aiNode* pc;
                // setup a new node
                *piParent->mChildren++ = pc = new aiNode();
                pc->mName = aiString(bones[i].mName);
                pc->mParent = piParent;

                // get the transformation matrix from rotation and translational components
                aiQuaternion quat;
                MD5::ConvertQuaternion ( bones[i].mRotationQuat, quat );

                bones[i].mTransform = aiMatrix4x4 ( quat.GetMatrix());
                bones[i].mTransform.a4 = bones[i].mPositionXYZ.x;
                bones[i].mTransform.b4 = bones[i].mPositionXYZ.y;
                bones[i].mTransform.c4 = bones[i].mPositionXYZ.z;

                // store it for later use
                pc->mTransformation = bones[i].mInvTransform = bones[i].mTransform;
                bones[i].mInvTransform.Inverse();

                // the transformations for each bone are absolute, so we need to multiply them
                // with the inverse of the absolute matrix of the parent joint
                if (-1 != iParentID)    {
                    pc->mTransformation = bones[iParentID].mInvTransform * pc->mTransformation;
                }

                // add children to this node, too
                AttachChilds_Mesh( i, pc, bones);
            }
        }
        // undo offset computations
        piParent->mChildren -= piParent->mNumChildren;
    }
}